

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

bool __thiscall cfd::core::DescriptorNode::ExistUncompressedKey(DescriptorNode *this)

{
  bool bVar1;
  reference this_00;
  DescriptorNode *child;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *__range2;
  DescriptorNode *this_local;
  
  if ((this->is_uncompressed_key_ & 1U) == 0) {
    __end2 = ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
             begin(&this->child_node_);
    child = (DescriptorNode *)
            ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            end(&this->child_node_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                                       *)&child), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                ::operator*(&__end2);
      bVar1 = ExistUncompressedKey(this_00);
      if (bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorNode::ExistUncompressedKey() {
  if (is_uncompressed_key_) return true;
  for (auto& child : child_node_) {
    if (child.ExistUncompressedKey()) return true;
  }
  return false;
}